

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall Assimp::SMDImporter::CreateOutputMeshes(SMDImporter *this)

{
  aiFace *paVar1;
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *pvVar2;
  aiMatrix4x4 *paVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pBVar6;
  pointer pBVar7;
  iterator iVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Vertex *pVVar23;
  aiMesh **ppaVar24;
  aiMesh *paVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  aiFace *paVar29;
  aiVector3D *__s;
  uint *puVar30;
  Logger *pLVar31;
  aiBone **ppaVar32;
  aiBone *paVar33;
  aiVertexWeight *__s_00;
  long lVar34;
  pointer ppVar35;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar36;
  uint uVar37;
  iterator iVar38;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  aiScene *paVar39;
  ulong *puVar40;
  pointer pFVar41;
  uint iVert;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  uint local_cc;
  undefined8 local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c0;
  ulong local_b8;
  uint local_ac;
  aiVector3D *local_a8;
  aiVector3D *local_a0;
  ulong *local_98;
  undefined1 local_90 [8];
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ulong *local_70;
  aiVector3D *local_68;
  aiMesh **local_60;
  ulong *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  Vertex *local_40;
  long local_38;
  
  if ((this->aszTextures).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->aszTextures).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_90 = (undefined1  [8])&local_80;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->aszTextures,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    if (local_90 != (undefined1  [8])&local_80) {
      operator_delete((void *)local_90);
    }
  }
  this->pScene->mNumMeshes =
       (uint)((ulong)((long)(this->aszTextures).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->aszTextures).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  paVar39 = this->pScene;
  ppaVar24 = (aiMesh **)operator_new__((ulong)paVar39->mNumMeshes << 3);
  paVar39->mMeshes = ppaVar24;
  paVar39 = this->pScene;
  uVar37 = paVar39->mNumMeshes;
  uVar44 = (ulong)uVar37;
  local_58 = (ulong *)operator_new__(uVar44 * 0x18 + 8);
  *local_58 = uVar44;
  pvVar36 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_58 + 1);
  if (uVar37 != 0) {
    memset(pvVar36,0,((uVar44 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  uVar44 = (ulong)(uint)((int)((ulong)((long)(this->asTriangles).
                                             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->asTriangles).
                                            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x3d70a3d7) / (ulong)paVar39->mNumMeshes;
  local_cc = (int)(uVar44 >> 1) + (int)uVar44;
  local_c0 = pvVar36;
  if (this->pScene->mNumMeshes != 0) {
    uVar44 = 0;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(pvVar36,(ulong)local_cc);
      uVar44 = uVar44 + 1;
      pvVar36 = pvVar36 + 1;
    } while (uVar44 < this->pScene->mNumMeshes);
  }
  local_cc = 0;
  pFVar41 = (this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pFVar41 !=
      (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pvVar36 = local_c0;
    do {
      uVar44 = (ulong)pFVar41->iTexture;
      if (uVar44 == 0xffffffff) {
        this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar36 + 0xffffffff);
        local_90 = (undefined1  [8])((ulong)local_90 & 0xffffffff00000000);
        iVar38._M_current =
             pvVar36[0xffffffff].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar38._M_current !=
            pvVar36[0xffffffff].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          *iVar38._M_current = 0;
          goto LAB_0060e214;
        }
LAB_0060e21b:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,iVar38,
                   (uint *)local_90);
        pvVar36 = local_c0;
      }
      else {
        if (uVar44 < (ulong)((long)(this->aszTextures).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->aszTextures).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar36 + uVar44);
          iVar38._M_current = *(uint **)(this_00 + 8);
          if (iVar38._M_current == *(uint **)(this_00 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(this_00,iVar38,&local_cc);
            pvVar36 = local_c0;
            goto LAB_0060e232;
          }
          *iVar38._M_current = local_cc;
        }
        else {
          pLVar31 = DefaultLogger::get();
          Logger::info(pLVar31,"[SMD/VTA] Material index overflow in face");
          this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                    (local_c0 + pFVar41->iTexture);
          uVar37 = (int)((ulong)((long)(this->aszTextures).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->aszTextures).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          local_90._0_4_ = uVar37;
          iVar38._M_current = *(uint **)(this_00 + 8);
          if (iVar38._M_current == *(uint **)(this_00 + 0x10)) goto LAB_0060e21b;
          *iVar38._M_current = uVar37;
          pvVar36 = local_c0;
        }
LAB_0060e214:
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
      }
LAB_0060e232:
      local_cc = local_cc + 1;
      pFVar41 = pFVar41 + 1;
    } while (pFVar41 !=
             (this->asTriangles).
             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  paVar39 = this->pScene;
  if (paVar39->mNumMeshes != 0) {
    uVar37 = 0;
    do {
      local_ac = uVar37;
      paVar25 = (aiMesh *)operator_new(0x520);
      paVar25->mPrimitiveTypes = 0;
      paVar25->mNumVertices = 0;
      paVar25->mNumFaces = 0;
      memset(&paVar25->mVertices,0,0xcc);
      paVar25->mBones = (aiBone **)0x0;
      paVar25->mMaterialIndex = 0;
      (paVar25->mName).length = 0;
      (paVar25->mName).data[0] = '\0';
      memset((paVar25->mName).data + 1,0x1b,0x3ff);
      paVar25->mNumAnimMeshes = 0;
      paVar25->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar25->mMethod = 0;
      (paVar25->mAABB).mMin.x = 0.0;
      (paVar25->mAABB).mMin.y = 0.0;
      (paVar25->mAABB).mMin.z = 0.0;
      (paVar25->mAABB).mMax.x = 0.0;
      (paVar25->mAABB).mMax.y = 0.0;
      (paVar25->mAABB).mMax.z = 0.0;
      paVar25->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar25->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar25->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar25->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar25->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar25->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar25->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar25->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar25->mNumUVComponents[0] = 0;
      paVar25->mNumUVComponents[1] = 0;
      paVar25->mNumUVComponents[2] = 0;
      paVar25->mNumUVComponents[3] = 0;
      paVar25->mNumUVComponents[4] = 0;
      paVar25->mNumUVComponents[5] = 0;
      paVar25->mNumUVComponents[6] = 0;
      paVar25->mNumUVComponents[7] = 0;
      paVar25->mColors[0] = (aiColor4D *)0x0;
      paVar25->mColors[1] = (aiColor4D *)0x0;
      paVar25->mColors[2] = (aiColor4D *)0x0;
      paVar25->mColors[3] = (aiColor4D *)0x0;
      paVar25->mColors[4] = (aiColor4D *)0x0;
      paVar25->mColors[5] = (aiColor4D *)0x0;
      paVar25->mColors[6] = (aiColor4D *)0x0;
      paVar25->mColors[7] = (aiColor4D *)0x0;
      ppaVar24 = paVar39->mMeshes;
      uVar44 = (ulong)local_ac;
      ppaVar24[uVar44] = paVar25;
      puVar4 = local_c0[uVar44].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar5 = local_c0[uVar44].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar4 == puVar5) {
        __assert_fail("!aaiFaces[i].empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SMD/SMDLoader.cpp"
                      ,0x10c,"void Assimp::SMDImporter::CreateOutputMeshes()");
      }
      local_50 = local_c0 + uVar44;
      paVar25->mPrimitiveTypes = 4;
      ppaVar24[uVar44]->mNumVertices = (int)((ulong)((long)puVar5 - (long)puVar4) >> 2) * 3;
      ppaVar24[uVar44]->mNumFaces =
           (uint)((ulong)((long)(local_50->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_50->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      ppaVar24[uVar44]->mMaterialIndex = local_ac;
      pBVar6 = (this->asBones).
               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pBVar7 = (this->asBones).
               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar42 = (long)pBVar6 - (long)pBVar7 >> 4;
      uVar43 = lVar42 * -0x71c71c71c71c71c7;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar43;
      uVar26 = SUB168(auVar10 * ZEXT816(0x18),0);
      uVar27 = uVar26 + 8;
      if (0xfffffffffffffff7 < uVar26) {
        uVar27 = 0xffffffffffffffff;
      }
      if (SUB168(auVar10 * ZEXT816(0x18),8) != 0) {
        uVar27 = 0xffffffffffffffff;
      }
      local_b8 = uVar44;
      local_70 = (ulong *)operator_new__(uVar27);
      uVar44 = local_b8;
      puVar40 = local_70 + 1;
      *local_70 = uVar43;
      if (pBVar6 != pBVar7) {
        lVar34 = 0;
        do {
          *(undefined8 *)((long)puVar40 + lVar34) = 0;
          ((undefined8 *)((long)puVar40 + lVar34))[1] = 0;
          *(undefined8 *)((long)local_70 + lVar34 + 0x18) = 0;
          lVar34 = lVar34 + 0x18;
        } while (lVar42 * 0x5555555555555558 != lVar34);
      }
      lVar42 = (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar42 != 0) {
        uVar43 = (lVar42 >> 4) * -0x71c71c71c71c71c7;
        uVar26 = 0;
        uVar27 = 1;
        do {
          std::
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
          reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)(puVar40 + uVar26 * 3),ppaVar24[uVar44]->mNumVertices / uVar43);
          uVar43 = ((long)(this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
          bVar45 = uVar27 <= uVar43;
          lVar42 = uVar43 - uVar27;
          uVar26 = uVar27;
          uVar27 = (ulong)((int)uVar27 + 1);
        } while (bVar45 && lVar42 != 0);
      }
      uVar44 = (ulong)ppaVar24[uVar44]->mNumFaces;
      puVar28 = (ulong *)operator_new__(uVar44 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar28 + 1);
      *puVar28 = uVar44;
      if (uVar44 != 0) {
        paVar29 = paVar1;
        do {
          paVar29->mNumIndices = 0;
          paVar29->mIndices = (uint *)0x0;
          paVar29 = paVar29 + 1;
        } while (paVar29 != paVar1 + uVar44);
      }
      ppaVar24[local_b8]->mFaces = paVar1;
      uVar37 = ppaVar24[local_b8]->mNumVertices;
      local_a0 = (aiVector3D *)operator_new__((ulong)uVar37 * 0xc);
      if (uVar37 != 0) {
        memset(local_a0,0,(((ulong)uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      ppaVar24[local_b8]->mNormals = local_a0;
      uVar37 = ppaVar24[local_b8]->mNumVertices;
      local_a8 = (aiVector3D *)operator_new__((ulong)uVar37 * 0xc);
      if (uVar37 != 0) {
        memset(local_a8,0,(((ulong)uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      ppaVar24[local_b8]->mVertices = local_a8;
      if (this->bHasUVs == true) {
        uVar37 = ppaVar24[local_b8]->mNumVertices;
        __s = (aiVector3D *)operator_new__((ulong)uVar37 * 0xc);
        if (uVar37 != 0) {
          memset(__s,0,(((ulong)uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        ppaVar24[local_b8]->mTextureCoords[0] = __s;
        ppaVar24[local_b8]->mNumUVComponents[0] = 2;
      }
      else {
        __s = (aiVector3D *)0x0;
      }
      local_cc = 0;
      local_98 = puVar40;
      local_60 = ppaVar24;
      if (ppaVar24[local_b8]->mNumFaces != 0) {
        uVar44 = 0;
        do {
          uVar26 = local_b8;
          puVar30 = (uint *)operator_new__(0xc);
          local_38 = uVar44 * 0x10;
          ppaVar24[uVar26]->mFaces[uVar44].mIndices = puVar30;
          ppaVar24[uVar26]->mFaces[uVar44].mNumIndices = 3;
          uVar37 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar44];
          pFVar41 = (this->asTriangles).
                    super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_a8->z = pFVar41[uVar37].avVertices[0].pos.z;
          fVar14 = pFVar41[uVar37].avVertices[0].pos.y;
          local_a8->x = pFVar41[uVar37].avVertices[0].pos.x;
          local_a8->y = fVar14;
          local_a8[1].z = pFVar41[uVar37].avVertices[1].pos.z;
          fVar14 = pFVar41[uVar37].avVertices[1].pos.y;
          local_a8[1].x = pFVar41[uVar37].avVertices[1].pos.x;
          local_a8[1].y = fVar14;
          local_a8[2].z = pFVar41[uVar37].avVertices[2].pos.z;
          fVar14 = pFVar41[uVar37].avVertices[2].pos.y;
          local_a8[2].x = pFVar41[uVar37].avVertices[2].pos.x;
          local_a8[2].y = fVar14;
          local_a0->z = pFVar41[uVar37].avVertices[0].nor.z;
          fVar14 = pFVar41[uVar37].avVertices[0].nor.y;
          local_a0->x = pFVar41[uVar37].avVertices[0].nor.x;
          local_a0->y = fVar14;
          fVar14 = pFVar41[uVar37].avVertices[1].nor.y;
          local_a0[1].x = pFVar41[uVar37].avVertices[1].nor.x;
          local_a0[1].y = fVar14;
          local_a0[1].z = pFVar41[uVar37].avVertices[1].nor.z;
          fVar14 = pFVar41[uVar37].avVertices[2].nor.y;
          local_a0[2].x = pFVar41[uVar37].avVertices[2].nor.x;
          local_a0[2].y = fVar14;
          local_a0[2].z = pFVar41[uVar37].avVertices[2].nor.z;
          if (__s == (aiVector3D *)0x0) {
            local_68 = (aiVector3D *)0x0;
          }
          else {
            __s->z = pFVar41[uVar37].avVertices[0].uv.z;
            fVar14 = pFVar41[uVar37].avVertices[0].uv.y;
            __s->x = pFVar41[uVar37].avVertices[0].uv.x;
            __s->y = fVar14;
            fVar14 = pFVar41[uVar37].avVertices[1].uv.y;
            __s[1].x = pFVar41[uVar37].avVertices[1].uv.x;
            __s[1].y = fVar14;
            __s[1].z = pFVar41[uVar37].avVertices[1].uv.z;
            fVar14 = pFVar41[uVar37].avVertices[2].uv.y;
            __s[2].x = pFVar41[uVar37].avVertices[2].uv.x;
            __s[2].y = fVar14;
            __s[2].z = pFVar41[uVar37].avVertices[2].uv.z;
            local_68 = __s + 3;
          }
          local_40 = pFVar41[uVar37].avVertices;
          local_a8 = local_a8 + 3;
          local_a0 = local_a0 + 3;
          lVar42 = 0;
          local_48 = uVar44;
          do {
            pVVar23 = local_40;
            ppVar35 = *(pointer *)
                       &local_40[lVar42].aiBoneLinks.
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl;
            if (*(pointer *)
                 ((long)&local_40[lVar42].aiBoneLinks.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl + 8) == ppVar35) {
              local_c8 = (ulong)local_c8._4_4_ << 0x20;
            }
            else {
              local_c8 = (ulong)local_c8._4_4_ << 0x20;
              uVar37 = 1;
              uVar44 = 0;
              do {
                uVar26 = (ulong)ppVar35[uVar44].first;
                uVar27 = ((long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x71c71c71c71c71c7;
                if ((uVar27 < uVar26 || uVar27 - uVar26 == 0) ||
                   (ppVar35[uVar44].first == pVVar23[lVar42].iParentNode)) {
                  pLVar31 = DefaultLogger::get();
                  Logger::error(pLVar31,
                                "[SMD/VTA] Bone index overflow. The bone index will be ignored, the weight will be assigned to the vertex\' parent node"
                               );
                }
                else {
                  pvVar2 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                            *)(local_98 + uVar26 * 3);
                  local_90._4_4_ = ppVar35[uVar44].second;
                  local_90._0_4_ = local_cc;
                  iVar8._M_current = *(pair<unsigned_int,_float> **)(pvVar2 + 8);
                  if (iVar8._M_current == *(pair<unsigned_int,_float> **)(pvVar2 + 0x10)) {
                    std::
                    vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                    ::_M_realloc_insert<std::pair<unsigned_int,float>>
                              (pvVar2,iVar8,(pair<unsigned_int,_float> *)local_90);
                  }
                  else {
                    (iVar8._M_current)->first = local_cc;
                    (iVar8._M_current)->second = (float)local_90._4_4_;
                    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
                  }
                  local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8 + ppVar35[uVar44].second);
                }
                uVar44 = (ulong)uVar37;
                ppVar35 = pVVar23[lVar42].aiBoneLinks.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar37 = uVar37 + 1;
              } while (uVar44 < (ulong)((long)*(pointer *)
                                               ((long)&pVVar23[lVar42].aiBoneLinks.
                                                                                                              
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  ._M_impl + 8) - (long)ppVar35 >> 3));
            }
            ppaVar24 = local_60;
            puVar40 = local_98;
            if (((float)local_c8 < 0.975) &&
               (uVar44 = (ulong)pVVar23[lVar42].iParentNode, uVar44 != 0xffffffff)) {
              uVar26 = ((long)(this->asBones).
                              super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->asBones).
                              super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
              if (uVar26 < uVar44 || uVar26 - uVar44 == 0) {
                pLVar31 = DefaultLogger::get();
                Logger::error(pLVar31,
                              "[SMD/VTA] Bone index overflow. The index of the vertex parent bone is invalid. The remaining weights will be normalized to 1.0"
                             );
                if ((((float)local_c8 != 0.0) || (NAN((float)local_c8))) &&
                   (ppVar35 = pVVar23[lVar42].aiBoneLinks.
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pVVar23[lVar42].aiBoneLinks.
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl + 8) != ppVar35)) {
                  uVar37 = 1;
                  uVar44 = 0;
                  do {
                    uVar44 = (ulong)ppVar35[uVar44].first;
                    uVar26 = ((long)(this->asBones).
                                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->asBones).
                                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x71c71c71c71c71c7;
                    if (uVar44 <= uVar26 && uVar26 - uVar44 != 0) {
                      *(float *)(puVar40[uVar44 * 3 + 1] - 4) =
                           *(float *)(puVar40[uVar44 * 3 + 1] - 4) * (1.0 / (float)local_c8);
                    }
                    uVar44 = (ulong)uVar37;
                    ppVar35 = pVVar23[lVar42].aiBoneLinks.
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar37 = uVar37 + 1;
                  } while (uVar44 < (ulong)((long)*(pointer *)
                                                   ((long)&pVVar23[lVar42].aiBoneLinks.
                                                                                                                      
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  ._M_impl + 8) - (long)ppVar35 >> 3));
                }
              }
              else {
                pvVar2 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                          *)(local_98 + uVar44 * 3);
                local_90._4_4_ = 1.0 - (float)local_c8;
                local_90._0_4_ = local_cc;
                iVar8._M_current = *(pair<unsigned_int,_float> **)(pvVar2 + 8);
                if (iVar8._M_current == *(pair<unsigned_int,_float> **)(pvVar2 + 0x10)) {
                  std::
                  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  ::_M_realloc_insert<std::pair<unsigned_int,float>>
                            (pvVar2,iVar8,(pair<unsigned_int,_float> *)local_90);
                }
                else {
                  (iVar8._M_current)->first = local_cc;
                  (iVar8._M_current)->second = 1.0 - (float)local_c8;
                  *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
                }
              }
            }
            uVar37 = local_cc + 1;
            *(uint *)(*(long *)((long)&ppaVar24[local_b8]->mFaces->mIndices + local_38) + lVar42 * 4
                     ) = local_cc;
            lVar42 = lVar42 + 1;
            local_cc = uVar37;
          } while (lVar42 != 3);
          uVar44 = local_48 + 1;
          __s = local_68;
        } while (uVar44 < ppaVar24[local_b8]->mNumFaces);
      }
      uVar44 = local_b8;
      local_cc = 0;
      lVar42 = (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar42 != 0) {
        uVar27 = (lVar42 >> 4) * -0x71c71c71c71c71c7;
        uVar37 = 0;
        puVar28 = local_70 + 2;
        uVar26 = 1;
        do {
          if (puVar28[-1] != *puVar28) {
            uVar37 = uVar37 + 1;
            local_cc = uVar37;
          }
          puVar28 = puVar28 + 3;
          bVar45 = uVar26 <= uVar27;
          lVar42 = uVar27 - uVar26;
          uVar26 = (ulong)((int)uVar26 + 1);
        } while (bVar45 && lVar42 != 0);
      }
      if (local_cc != 0) {
        ppaVar24[local_b8]->mNumBones = local_cc;
        ppaVar32 = (aiBone **)operator_new__((ulong)ppaVar24[local_b8]->mNumBones << 3);
        ppaVar24[uVar44]->mBones = ppaVar32;
        local_cc = 0;
        if ((this->asBones).
            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->asBones).
            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar26 = 0;
          do {
            if (puVar40[uVar26 * 3] != puVar40[uVar26 * 3 + 1]) {
              puVar40 = puVar40 + uVar26 * 3;
              paVar33 = (aiBone *)operator_new(0x450);
              (paVar33->mName).length = 0;
              (paVar33->mName).data[0] = '\0';
              memset((paVar33->mName).data + 1,0x1b,0x3ff);
              paVar33->mNumWeights = 0;
              paVar33->mWeights = (aiVertexWeight *)0x0;
              (paVar33->mOffsetMatrix).a1 = 1.0;
              (paVar33->mOffsetMatrix).a2 = 0.0;
              (paVar33->mOffsetMatrix).a3 = 0.0;
              (paVar33->mOffsetMatrix).a4 = 0.0;
              (paVar33->mOffsetMatrix).b1 = 0.0;
              (paVar33->mOffsetMatrix).b2 = 1.0;
              (paVar33->mOffsetMatrix).b3 = 0.0;
              (paVar33->mOffsetMatrix).b4 = 0.0;
              (paVar33->mOffsetMatrix).c1 = 0.0;
              (paVar33->mOffsetMatrix).c2 = 0.0;
              (paVar33->mOffsetMatrix).c3 = 1.0;
              (paVar33->mOffsetMatrix).c4 = 0.0;
              (paVar33->mOffsetMatrix).d1 = 0.0;
              (paVar33->mOffsetMatrix).d2 = 0.0;
              (paVar33->mOffsetMatrix).d3 = 0.0;
              (paVar33->mOffsetMatrix).d4 = 1.0;
              ppaVar32 = ppaVar24[uVar44]->mBones;
              uVar44 = (ulong)local_cc;
              ppaVar32[uVar44] = paVar33;
              paVar33->mNumWeights = (uint)(puVar40[1] - *puVar40 >> 3);
              uVar37 = ppaVar32[uVar44]->mNumWeights;
              local_c8 = (ulong)uVar37 * 8;
              __s_00 = (aiVertexWeight *)operator_new__(local_c8);
              if ((ulong)uVar37 != 0) {
                memset(__s_00,0,local_c8);
              }
              ppaVar32[uVar44]->mWeights = __s_00;
              pBVar6 = (this->asBones).
                       super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar33 = ppaVar32[uVar44];
              paVar3 = &pBVar6[uVar26].mOffsetMatrix;
              fVar19 = paVar3->a1;
              fVar20 = paVar3->a2;
              fVar21 = paVar3->a3;
              fVar22 = paVar3->a4;
              pBVar7 = pBVar6 + uVar26;
              fVar17 = (pBVar7->mOffsetMatrix).b1;
              fVar18 = (pBVar7->mOffsetMatrix).b2;
              uVar11 = *(undefined8 *)(&(pBVar7->mOffsetMatrix).b1 + 2);
              pBVar7 = pBVar6 + uVar26;
              fVar15 = (pBVar7->mOffsetMatrix).c1;
              fVar16 = (pBVar7->mOffsetMatrix).c2;
              uVar12 = *(undefined8 *)(&(pBVar7->mOffsetMatrix).c1 + 2);
              pBVar6 = pBVar6 + uVar26;
              fVar14 = (pBVar6->mOffsetMatrix).d2;
              uVar13 = *(undefined8 *)(&(pBVar6->mOffsetMatrix).d1 + 2);
              (paVar33->mOffsetMatrix).d1 = (pBVar6->mOffsetMatrix).d1;
              (paVar33->mOffsetMatrix).d2 = fVar14;
              *(undefined8 *)&(paVar33->mOffsetMatrix).d3 = uVar13;
              (paVar33->mOffsetMatrix).c1 = fVar15;
              (paVar33->mOffsetMatrix).c2 = fVar16;
              *(undefined8 *)&(paVar33->mOffsetMatrix).c3 = uVar12;
              (paVar33->mOffsetMatrix).b1 = fVar17;
              (paVar33->mOffsetMatrix).b2 = fVar18;
              *(undefined8 *)&(paVar33->mOffsetMatrix).b3 = uVar11;
              (paVar33->mOffsetMatrix).a1 = fVar19;
              (paVar33->mOffsetMatrix).a2 = fVar20;
              (paVar33->mOffsetMatrix).a3 = fVar21;
              (paVar33->mOffsetMatrix).a4 = fVar22;
              pBVar6 = (this->asBones).
                       super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar27 = pBVar6[uVar26].mName._M_string_length;
              if (uVar27 < 0x400) {
                paVar33 = ppaVar32[uVar44];
                (paVar33->mName).length = (ai_uint32)uVar27;
                local_c8 = uVar27;
                memcpy((paVar33->mName).data,pBVar6[uVar26].mName._M_dataplus._M_p,uVar27);
                (paVar33->mName).data[local_c8] = '\0';
              }
              (this->asBones).
              super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
              super__Vector_impl_data._M_start[uVar26].bIsUsed = true;
              paVar33 = ppaVar32[uVar44];
              if (paVar33->mNumWeights != 0) {
                uVar27 = 0;
                do {
                  paVar33->mWeights[uVar27].mVertexId = *(uint *)(*puVar40 + uVar27 * 8);
                  ppaVar32[uVar44]->mWeights[uVar27].mWeight = *(float *)(*puVar40 + 4 + uVar27 * 8)
                  ;
                  uVar27 = uVar27 + 1;
                  paVar33 = ppaVar32[uVar44];
                } while (uVar27 < paVar33->mNumWeights);
              }
              local_cc = local_cc + 1;
              puVar40 = local_98;
              ppaVar24 = local_60;
              uVar44 = local_b8;
            }
            uVar26 = (ulong)((int)uVar26 + 1);
            uVar27 = ((long)(this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
          } while (uVar26 <= uVar27 && uVar27 - uVar26 != 0);
        }
      }
      puVar40 = local_70;
      if (*local_70 != 0) {
        lVar42 = *local_70 * 0x18;
        do {
          pvVar9 = *(void **)((long)puVar40 + lVar42 + -0x10);
          if (pvVar9 != (void *)0x0) {
            operator_delete(pvVar9);
          }
          lVar42 = lVar42 + -0x18;
        } while (lVar42 != 0);
      }
      operator_delete__(puVar40);
      uVar37 = local_ac + 1;
      paVar39 = this->pScene;
    } while (uVar37 < paVar39->mNumMeshes);
  }
  puVar40 = local_58;
  if (*local_58 != 0) {
    lVar42 = *local_58 * 0x18;
    do {
      pvVar9 = *(void **)((long)puVar40 + lVar42 + -0x10);
      if (pvVar9 != (void *)0x0) {
        operator_delete(pvVar9);
      }
      lVar42 = lVar42 + -0x18;
    } while (lVar42 != 0);
  }
  operator_delete__(puVar40);
  return;
}

Assistant:

void SMDImporter::CreateOutputMeshes() {
    if (aszTextures.empty()) {
        aszTextures.push_back(std::string());
    }

    // we need to sort all faces by their material index
    // in opposition to other loaders we can be sure that each
    // material is at least used once.
    pScene->mNumMeshes = (unsigned int) aszTextures.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    typedef std::vector<unsigned int> FaceList;
    FaceList* aaiFaces = new FaceList[pScene->mNumMeshes];

    // approximate the space that will be required
    unsigned int iNum = (unsigned int)asTriangles.size() / pScene->mNumMeshes;
    iNum += iNum >> 1;
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aaiFaces[i].reserve(iNum);
    }

    // collect all faces
    iNum = 0;
    for (std::vector<SMD::Face>::const_iterator
            iFace =  asTriangles.begin();
            iFace != asTriangles.end();++iFace,++iNum) {
        if (UINT_MAX == (*iFace).iTexture) {
            aaiFaces[(*iFace).iTexture].push_back( 0 );
        } else if ((*iFace).iTexture >= aszTextures.size()) {
            ASSIMP_LOG_INFO("[SMD/VTA] Material index overflow in face");
            aaiFaces[(*iFace).iTexture].push_back((unsigned int)aszTextures.size()-1);
        } else {
            aaiFaces[(*iFace).iTexture].push_back(iNum);
        }
    }

    // now create the output meshes
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh*& pcMesh = pScene->mMeshes[i] = new aiMesh();
        ai_assert(!aaiFaces[i].empty()); // should not be empty ...

        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        pcMesh->mNumVertices = (unsigned int)aaiFaces[i].size()*3;
        pcMesh->mNumFaces = (unsigned int)aaiFaces[i].size();
        pcMesh->mMaterialIndex = i;

        // storage for bones
        typedef std::pair<unsigned int,float> TempWeightListEntry;
        typedef std::vector< TempWeightListEntry > TempBoneWeightList;

        TempBoneWeightList* aaiBones = new TempBoneWeightList[asBones.size()]();

        // try to reserve enough memory without wasting too much
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            aaiBones[iBone].reserve(pcMesh->mNumVertices/asBones.size());
        }

        // allocate storage
        pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
        aiVector3D* pcNormals = pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcVerts = pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];

        aiVector3D* pcUVs = nullptr;
        if (bHasUVs) {
            pcUVs = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNumUVComponents[0] = 2;
        }

        iNum = 0;
        for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
            pcMesh->mFaces[iFace].mIndices = new unsigned int[3];
            pcMesh->mFaces[iFace].mNumIndices = 3;

            // fill the vertices
            unsigned int iSrcFace = aaiFaces[i][iFace];
            SMD::Face& face = asTriangles[iSrcFace];

            *pcVerts++ = face.avVertices[0].pos;
            *pcVerts++ = face.avVertices[1].pos;
            *pcVerts++ = face.avVertices[2].pos;

            // fill the normals
            *pcNormals++ = face.avVertices[0].nor;
            *pcNormals++ = face.avVertices[1].nor;
            *pcNormals++ = face.avVertices[2].nor;

            // fill the texture coordinates
            if (pcUVs) {
                *pcUVs++ = face.avVertices[0].uv;
                *pcUVs++ = face.avVertices[1].uv;
                *pcUVs++ = face.avVertices[2].uv;
            }

            for (unsigned int iVert = 0; iVert < 3;++iVert) {
                float fSum = 0.0f;
                for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone)  {
                    TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];

                    // FIX: The second check is here just to make sure we won't
                    // assign more than one weight to a single vertex index
                    if (pairval.first >= asBones.size() || pairval.first == face.avVertices[iVert].iParentNode) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The bone index will be ignored, the weight will be assigned "
                            "to the vertex' parent node");
                        continue;
                    }
                    aaiBones[pairval.first].push_back(TempWeightListEntry(iNum,pairval.second));
                    fSum += pairval.second;
                }
                // ******************************************************************
                // If the sum of all vertex weights is not 1.0 we must assign
                // the rest to the vertex' parent node. Well, at least the doc says
                // we should ...
                // FIX: We use 0.975 as limit, floating-point inaccuracies seem to
                // be very strong in some SMD exporters. Furthermore it is possible
                // that the parent of a vertex is 0xffffffff (if the corresponding
                // entry in the file was unreadable)
                // ******************************************************************
                if (fSum < 0.975f && face.avVertices[iVert].iParentNode != UINT_MAX) {
                    if (face.avVertices[iVert].iParentNode >= asBones.size()) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The index of the vertex parent bone is invalid. "
                            "The remaining weights will be normalized to 1.0");

                        if (fSum) {
                            fSum = 1 / fSum;
                            for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone) {
                                TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];
                                if (pairval.first >= asBones.size()) {
                                    continue;
                                }
                                aaiBones[pairval.first].back().second *= fSum;
                            }
                        }
                    } else {
                        aaiBones[face.avVertices[iVert].iParentNode].push_back(
                            TempWeightListEntry(iNum,1.0f-fSum));
                    }
                }
                pcMesh->mFaces[iFace].mIndices[iVert] = iNum++;
            }
        }

        // now build all bones of the mesh
        iNum = 0;
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            if (!aaiBones[iBone].empty())++iNum;
        }

        if (iNum) {
            pcMesh->mNumBones = iNum;
            pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
            iNum = 0;
            for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
                if (aaiBones[iBone].empty()) {
                    continue;
                }
                aiBone*& bone = pcMesh->mBones[iNum] = new aiBone();

                bone->mNumWeights = (unsigned int)aaiBones[iBone].size();
                bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                bone->mOffsetMatrix = asBones[iBone].mOffsetMatrix;
                bone->mName.Set( asBones[iBone].mName );

                asBones[iBone].bIsUsed = true;

                for (unsigned int iWeight = 0; iWeight < bone->mNumWeights;++iWeight) {
                    bone->mWeights[iWeight].mVertexId = aaiBones[iBone][iWeight].first;
                    bone->mWeights[iWeight].mWeight = aaiBones[iBone][iWeight].second;
                }
                ++iNum;
            }
        }
        delete[] aaiBones;
    }
    delete[] aaiFaces;
}